

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O2

FT_Error FT_Outline_Done_Internal(FT_Memory memory,FT_Outline *outline)

{
  FT_Error FVar1;
  
  if (outline != (FT_Outline *)0x0) {
    if (memory == (FT_Memory)0x0) {
      FVar1 = 6;
    }
    else {
      if ((outline->flags & 1) != 0) {
        if (outline->points != (FT_Vector *)0x0) {
          (*memory->free)(memory,outline->points);
        }
        outline->points = (FT_Vector *)0x0;
        if (outline->tags != (char *)0x0) {
          (*memory->free)(memory,outline->tags);
        }
        outline->tags = (char *)0x0;
        if (outline->contours != (short *)0x0) {
          (*memory->free)(memory,outline->contours);
        }
      }
      outline->tags = (char *)0x0;
      outline->contours = (short *)0x0;
      outline->n_contours = 0;
      outline->n_points = 0;
      *(undefined4 *)&outline->field_0x4 = 0;
      outline->points = (FT_Vector *)0x0;
      *(undefined8 *)&outline->flags = 0;
      FVar1 = 0;
    }
    return FVar1;
  }
  return 0x14;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Done_Internal( FT_Memory    memory,
                            FT_Outline*  outline )
  {
    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !memory )
      return FT_THROW( Invalid_Argument );

    if ( outline->flags & FT_OUTLINE_OWNER )
    {
      FT_FREE( outline->points   );
      FT_FREE( outline->tags     );
      FT_FREE( outline->contours );
    }
    *outline = null_outline;

    return FT_Err_Ok;
  }